

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void read_wiener_filter(int wiener_win,WienerInfo *wiener_info,WienerInfo *ref_wiener_info,
                       aom_reader *rb)

{
  undefined8 uVar1;
  uint16_t uVar2;
  short sVar3;
  short sVar4;
  
  wiener_info->hfilter[0] = 0;
  wiener_info->hfilter[1] = 0;
  wiener_info->hfilter[2] = 0;
  wiener_info->hfilter[3] = 0;
  wiener_info->hfilter[4] = 0;
  wiener_info->hfilter[5] = 0;
  wiener_info->hfilter[6] = 0;
  wiener_info->hfilter[7] = 0;
  wiener_info->vfilter[0] = 0;
  wiener_info->vfilter[1] = 0;
  wiener_info->vfilter[2] = 0;
  wiener_info->vfilter[3] = 0;
  wiener_info->vfilter[4] = 0;
  wiener_info->vfilter[5] = 0;
  wiener_info->vfilter[6] = 0;
  wiener_info->vfilter[7] = 0;
  if (wiener_win == 7) {
    uVar2 = aom_read_primitive_refsubexpfin_
                      (rb,0x10,1,(short)*(undefined4 *)ref_wiener_info->vfilter + 5);
    sVar3 = uVar2 - 5;
  }
  else {
    sVar3 = 0;
  }
  wiener_info->vfilter[6] = sVar3;
  wiener_info->vfilter[0] = sVar3;
  uVar2 = aom_read_primitive_refsubexpfin_(rb,0x20,2,ref_wiener_info->vfilter[1] + 0x17);
  wiener_info->vfilter[5] = uVar2 - 0x17;
  wiener_info->vfilter[1] = uVar2 - 0x17;
  uVar2 = aom_read_primitive_refsubexpfin_
                    (rb,0x40,3,(short)*(undefined4 *)(ref_wiener_info->vfilter + 2) + 0x11);
  sVar4 = uVar2 - 0x11;
  sVar3 = wiener_info->vfilter[0];
  wiener_info->vfilter[4] = sVar4;
  wiener_info->vfilter[2] = sVar4;
  wiener_info->vfilter[3] = (sVar3 + sVar4 + wiener_info->vfilter[1]) * -2;
  if (wiener_win == 7) {
    uVar2 = aom_read_primitive_refsubexpfin_
                      (rb,0x10,1,(short)*(undefined4 *)ref_wiener_info->hfilter + 5);
    sVar3 = uVar2 - 5;
  }
  else {
    sVar3 = 0;
  }
  wiener_info->hfilter[6] = sVar3;
  wiener_info->hfilter[0] = sVar3;
  uVar2 = aom_read_primitive_refsubexpfin_(rb,0x20,2,ref_wiener_info->hfilter[1] + 0x17);
  wiener_info->hfilter[5] = uVar2 - 0x17;
  wiener_info->hfilter[1] = uVar2 - 0x17;
  uVar2 = aom_read_primitive_refsubexpfin_
                    (rb,0x40,3,(short)*(undefined4 *)(ref_wiener_info->hfilter + 2) + 0x11);
  sVar3 = uVar2 - 0x11;
  wiener_info->hfilter[4] = sVar3;
  wiener_info->hfilter[2] = sVar3;
  wiener_info->hfilter[3] = (sVar3 + wiener_info->hfilter[0] + wiener_info->hfilter[1]) * -2;
  uVar1 = *(undefined8 *)(wiener_info->vfilter + 4);
  *(undefined8 *)ref_wiener_info->vfilter = *(undefined8 *)wiener_info->vfilter;
  *(undefined8 *)(ref_wiener_info->vfilter + 4) = uVar1;
  uVar1 = *(undefined8 *)(wiener_info->hfilter + 4);
  *(undefined8 *)ref_wiener_info->hfilter = *(undefined8 *)wiener_info->hfilter;
  *(undefined8 *)(ref_wiener_info->hfilter + 4) = uVar1;
  return;
}

Assistant:

static inline void read_wiener_filter(int wiener_win, WienerInfo *wiener_info,
                                      WienerInfo *ref_wiener_info,
                                      aom_reader *rb) {
  memset(wiener_info->vfilter, 0, sizeof(wiener_info->vfilter));
  memset(wiener_info->hfilter, 0, sizeof(wiener_info->hfilter));

  if (wiener_win == WIENER_WIN)
    wiener_info->vfilter[0] = wiener_info->vfilter[WIENER_WIN - 1] =
        aom_read_primitive_refsubexpfin(
            rb, WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
            WIENER_FILT_TAP0_SUBEXP_K,
            ref_wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV, ACCT_STR) +
        WIENER_FILT_TAP0_MINV;
  else
    wiener_info->vfilter[0] = wiener_info->vfilter[WIENER_WIN - 1] = 0;
  wiener_info->vfilter[1] = wiener_info->vfilter[WIENER_WIN - 2] =
      aom_read_primitive_refsubexpfin(
          rb, WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
          WIENER_FILT_TAP1_SUBEXP_K,
          ref_wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV, ACCT_STR) +
      WIENER_FILT_TAP1_MINV;
  wiener_info->vfilter[2] = wiener_info->vfilter[WIENER_WIN - 3] =
      aom_read_primitive_refsubexpfin(
          rb, WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
          WIENER_FILT_TAP2_SUBEXP_K,
          ref_wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV, ACCT_STR) +
      WIENER_FILT_TAP2_MINV;
  // The central element has an implicit +WIENER_FILT_STEP
  wiener_info->vfilter[WIENER_HALFWIN] =
      -2 * (wiener_info->vfilter[0] + wiener_info->vfilter[1] +
            wiener_info->vfilter[2]);

  if (wiener_win == WIENER_WIN)
    wiener_info->hfilter[0] = wiener_info->hfilter[WIENER_WIN - 1] =
        aom_read_primitive_refsubexpfin(
            rb, WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
            WIENER_FILT_TAP0_SUBEXP_K,
            ref_wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV, ACCT_STR) +
        WIENER_FILT_TAP0_MINV;
  else
    wiener_info->hfilter[0] = wiener_info->hfilter[WIENER_WIN - 1] = 0;
  wiener_info->hfilter[1] = wiener_info->hfilter[WIENER_WIN - 2] =
      aom_read_primitive_refsubexpfin(
          rb, WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
          WIENER_FILT_TAP1_SUBEXP_K,
          ref_wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV, ACCT_STR) +
      WIENER_FILT_TAP1_MINV;
  wiener_info->hfilter[2] = wiener_info->hfilter[WIENER_WIN - 3] =
      aom_read_primitive_refsubexpfin(
          rb, WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
          WIENER_FILT_TAP2_SUBEXP_K,
          ref_wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV, ACCT_STR) +
      WIENER_FILT_TAP2_MINV;
  // The central element has an implicit +WIENER_FILT_STEP
  wiener_info->hfilter[WIENER_HALFWIN] =
      -2 * (wiener_info->hfilter[0] + wiener_info->hfilter[1] +
            wiener_info->hfilter[2]);
  memcpy(ref_wiener_info, wiener_info, sizeof(*wiener_info));
}